

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void slide(char *r,uint8_t *a)

{
  byte bVar1;
  int local_24;
  int local_20;
  int k;
  int b;
  int i;
  uint8_t *a_local;
  char *r_local;
  
  for (k = 0; k < 0x100; k = k + 1) {
    r[k] = (byte)((int)(uint)a[k >> 3] >> ((byte)k & 7)) & 1;
  }
  k = 0;
  do {
    if (0xff < k) {
      return;
    }
    if (r[k] != '\0') {
      for (local_20 = 1; local_20 < 7 && k + local_20 < 0x100; local_20 = local_20 + 1) {
        if (r[k + local_20] != '\0') {
          bVar1 = (byte)local_20;
          if ((int)r[k] + ((int)r[k + local_20] << (bVar1 & 0x1f)) < 0x10) {
            r[k] = r[k] + (char)((int)r[k + local_20] << (bVar1 & 0x1f));
            r[k + local_20] = '\0';
          }
          else {
            if ((int)r[k] - ((int)r[k + local_20] << (bVar1 & 0x1f)) < -0xf) break;
            r[k] = r[k] - (char)((int)r[k + local_20] << (bVar1 & 0x1f));
            for (local_24 = k + local_20; local_24 < 0x100; local_24 = local_24 + 1) {
              if (r[local_24] == '\0') {
                r[local_24] = '\x01';
                break;
              }
              r[local_24] = '\0';
            }
          }
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void slide(signed char *r, const uint8_t *a) {
  int i;
  int b;
  int k;

  for (i = 0; i < 256; ++i) {
    r[i] = 1 & (a[i >> 3] >> (i & 7));
  }

  for (i = 0; i < 256; ++i) {
    if (r[i]) {
      for (b = 1; b <= 6 && i + b < 256; ++b) {
        if (r[i + b]) {
          if (r[i] + (r[i + b] << b) <= 15) {
            r[i] += r[i + b] << b;
            r[i + b] = 0;
          } else if (r[i] - (r[i + b] << b) >= -15) {
            r[i] -= r[i + b] << b;
            for (k = i + b; k < 256; ++k) {
              if (!r[k]) {
                r[k] = 1;
                break;
              }
              r[k] = 0;
            }
          } else {
            break;
          }
        }
      }
    }
  }
}